

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O3

TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> * __thiscall
TPZAutoPointer<TPZFMatrix<std::complex<float>_>_>::operator=
          (TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *this,
          TPZAutoPointer<TPZFMatrix<std::complex<float>_>_> *copy)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  bool bVar3;
  
  pTVar2 = this->fRef;
  if (copy->fRef != pTVar2) {
    if (pTVar2 != (TPZReference *)0x0) {
      bVar3 = TPZReference::Decrease(pTVar2);
      if (bVar3) {
        if ((this->fRef != (TPZReference *)0x0) &&
           ((this->fRef->fCounter).super___atomic_base<int>._M_i == 0)) {
          pTVar2 = this->fRef;
          if ((pTVar2 != (TPZReference *)0x0) &&
             (pTVar2->fPointer != (TPZFMatrix<std::complex<float>_> *)0x0)) {
            (*(pTVar2->fPointer->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
              super_TPZSavable._vptr_TPZSavable[1])();
          }
          operator_delete(pTVar2,0x10);
        }
        this->fRef = (TPZReference *)0x0;
      }
    }
    pTVar2 = copy->fRef;
    this->fRef = pTVar2;
    LOCK();
    paVar1 = &pTVar2->fCounter;
    (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
  }
  return this;
}

Assistant:

TPZAutoPointer &operator=(const TPZAutoPointer<T> &copy)
	{
		if(copy.fRef == fRef) return *this;		
        else if (fRef && fRef->Decrease()){
            Release();
        }
		fRef = copy.fRef;
        copy.fRef->Increment();
        
		return *this;
	}